

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O1

void __thiscall flatbuffers::ts::TsGenerator::generateEnums(TsGenerator *this)

{
  Parser *pPVar1;
  pointer ppEVar2;
  EnumDef *enum_def;
  string enumcode;
  string type_name;
  import_set imports;
  import_set bare_imports;
  string local_f8;
  string local_d8;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  IdlNamer *local_98;
  import_set local_90;
  import_set local_60;
  
  pPVar1 = (this->super_BaseGenerator).parser_;
  ppEVar2 = (pPVar1->enums_).vec.
            super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppEVar2 !=
      (pPVar1->enums_).vec.
      super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_98 = &this->namer_;
    do {
      local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_t._M_impl.super__Rb_tree_header._M_header;
      local_60._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_90._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_90._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_90._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_90._M_t._M_impl.super__Rb_tree_header._M_header;
      local_90._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      local_f8._M_string_length = 0;
      local_f8.field_2._M_local_buf[0] = '\0';
      enum_def = *ppEVar2;
      local_90._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_90._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      GenEnum(this,enum_def,&local_f8,&local_90,false);
      GenEnum(this,enum_def,&local_f8,&local_90,true);
      (*(local_98->super_Namer)._vptr_Namer[0xf])(&local_b8,local_98,enum_def);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,local_b8,local_b0 + (long)local_b8);
      TrackNsDef(this,&enum_def->super_Definition,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      SaveType(this,&enum_def->super_Definition,&local_f8,&local_90,&local_60);
      if (local_b8 != local_a8) {
        enum_def = (EnumDef *)(local_a8[0] + 1);
        operator_delete(local_b8,(ulong)enum_def);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        enum_def = (EnumDef *)
                   (CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                             local_f8.field_2._M_local_buf[0]) + 1);
        operator_delete(local_f8._M_dataplus._M_p,(ulong)enum_def);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
      ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
                  *)local_90._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                 (_Link_type)enum_def);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
      ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::ImportDefinition>_>_>
                  *)local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                 (_Link_type)enum_def);
      ppEVar2 = ppEVar2 + 1;
    } while (ppEVar2 !=
             (((this->super_BaseGenerator).parser_)->enums_).vec.
             super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void generateEnums() {
    for (auto it = parser_.enums_.vec.begin(); it != parser_.enums_.vec.end();
         ++it) {
      import_set bare_imports;
      import_set imports;
      std::string enumcode;
      auto &enum_def = **it;
      GenEnum(enum_def, &enumcode, imports, false);
      GenEnum(enum_def, &enumcode, imports, true);
      std::string type_name = GetTypeName(enum_def);
      TrackNsDef(enum_def, type_name);
      SaveType(enum_def, enumcode, imports, bare_imports);
    }
  }